

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O2

Status * draco::PointCloudDecoder::DecodeHeader
                   (Status *__return_storage_ptr__,DecoderBuffer *buffer,DracoHeader *out_header)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_59;
  string local_58 [32];
  char kIoErrorMsg [30];
  
  builtin_strncpy(kIoErrorMsg + 0x10,"Draco header.",0xe);
  builtin_strncpy(kIoErrorMsg,"Failed to parse ",0x10);
  bVar1 = DecoderBuffer::Decode(buffer,out_header,5);
  if (bVar1) {
    iVar2 = bcmp(out_header,"DRACO",5);
    if (iVar2 == 0) {
      bVar1 = DecoderBuffer::Decode<unsigned_char>(buffer,&out_header->version_major);
      if (bVar1) {
        bVar1 = DecoderBuffer::Decode<unsigned_char>(buffer,&out_header->version_minor);
        if (bVar1) {
          bVar1 = DecoderBuffer::Decode<unsigned_char>(buffer,&out_header->encoder_type);
          if (bVar1) {
            bVar1 = DecoderBuffer::Decode<unsigned_char>(buffer,&out_header->encoder_method);
            if (bVar1) {
              bVar1 = DecoderBuffer::Decode<unsigned_short>(buffer,&out_header->flags);
              if (bVar1) {
                __return_storage_ptr__->code_ = OK;
                (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
                     (pointer)&(__return_storage_ptr__->error_msg_).field_2;
                (__return_storage_ptr__->error_msg_)._M_string_length = 0;
                (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
                return __return_storage_ptr__;
              }
              std::__cxx11::string::string<std::allocator<char>>(local_58,kIoErrorMsg,&local_59);
              __return_storage_ptr__->code_ = IO_ERROR;
              std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,local_58);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>(local_58,kIoErrorMsg,&local_59);
              __return_storage_ptr__->code_ = IO_ERROR;
              std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,local_58);
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>(local_58,kIoErrorMsg,&local_59);
            __return_storage_ptr__->code_ = IO_ERROR;
            std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,local_58);
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>(local_58,kIoErrorMsg,&local_59);
          __return_storage_ptr__->code_ = IO_ERROR;
          std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,local_58);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>(local_58,kIoErrorMsg,&local_59);
        __return_storage_ptr__->code_ = IO_ERROR;
        std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,local_58);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>(local_58,"Not a Draco file.",&local_59);
      __return_storage_ptr__->code_ = DRACO_ERROR;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,local_58);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>(local_58,kIoErrorMsg,&local_59);
    __return_storage_ptr__->code_ = IO_ERROR;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,local_58);
  }
  std::__cxx11::string::~string(local_58);
  return __return_storage_ptr__;
}

Assistant:

Status PointCloudDecoder::DecodeHeader(DecoderBuffer *buffer,
                                       DracoHeader *out_header) {
  constexpr char kIoErrorMsg[] = "Failed to parse Draco header.";
  if (!buffer->Decode(out_header->draco_string, 5)) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  if (memcmp(out_header->draco_string, "DRACO", 5) != 0) {
    return Status(Status::DRACO_ERROR, "Not a Draco file.");
  }
  if (!buffer->Decode(&(out_header->version_major))) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  if (!buffer->Decode(&(out_header->version_minor))) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  if (!buffer->Decode(&(out_header->encoder_type))) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  if (!buffer->Decode(&(out_header->encoder_method))) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  if (!buffer->Decode(&(out_header->flags))) {
    return Status(Status::IO_ERROR, kIoErrorMsg);
  }
  return OkStatus();
}